

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtRuntime.cpp
# Opt level: O0

void __thiscall
JsrtRuntime::JsrtRuntime
          (JsrtRuntime *this,ThreadContext *threadContext,bool useIdle,bool dispatchExceptions)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  AllocationPolicyManager *pAVar4;
  bool dispatchExceptions_local;
  bool useIdle_local;
  ThreadContext *threadContext_local;
  JsrtRuntime *this_local;
  
  JsrtThreadService::JsrtThreadService(&this->threadService);
  if (threadContext == (ThreadContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtRuntime.cpp"
                       ,0xc,"(threadContext != __null)","threadContext != NULL");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this->threadContext = threadContext;
  this->contextList = (JsrtContext *)0x0;
  this->collectCallback = (CollectCallBack *)0x0;
  this->beforeCollectCallback = (JsBeforeCollectCallback)0x0;
  this->beforeCollectCallbackContext = (void *)0x0;
  this->beforeSweepCallback = (JsBeforeSweepCallback)0x0;
  this->beforeSweepCallbackContext = (void *)0x0;
  pAVar4 = ThreadContext::GetAllocationPolicyManager(threadContext);
  this->allocationPolicyManager = pAVar4;
  this->useIdle = useIdle;
  this->dispatchExceptions = dispatchExceptions;
  if (useIdle) {
    JsrtThreadService::Initialize(&this->threadService,threadContext);
  }
  ThreadContext::SetJSRTRuntime(threadContext,this);
  this->serializeByteCodeForLibrary = false;
  this->jsrtDebugManager = (JsrtDebugManager *)0x0;
  return;
}

Assistant:

JsrtRuntime::JsrtRuntime(ThreadContext * threadContext, bool useIdle, bool dispatchExceptions)
{
    Assert(threadContext != NULL);
    this->threadContext = threadContext;
    this->contextList = NULL;
    this->collectCallback = NULL;
    this->beforeCollectCallback = NULL;
    this->beforeCollectCallbackContext = NULL;
#ifdef _CHAKRACOREBUILD
    this->beforeSweepCallback = NULL;
    this->beforeSweepCallbackContext = NULL;
#endif
    this->allocationPolicyManager = threadContext->GetAllocationPolicyManager();
    this->useIdle = useIdle;
    this->dispatchExceptions = dispatchExceptions;
    if (useIdle)
    {
        this->threadService.Initialize(threadContext);
    }
    threadContext->SetJSRTRuntime(this);

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    serializeByteCodeForLibrary = false;
#endif
#ifdef ENABLE_SCRIPT_DEBUGGING
    this->jsrtDebugManager = nullptr;
#endif
}